

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion QuaternionFromMatrix(Matrix mat)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  Quaternion QVar8;
  float in_stack_00000008;
  float in_stack_0000000c;
  
  if ((in_stack_00000008 <= mat.m12) || (in_stack_00000008 <= mat.m2)) {
    if (mat.m12 <= mat.m2) {
      fVar7 = ((mat.m2 + 1.0) - in_stack_00000008) - mat.m12;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      fVar7 = fVar7 + fVar7;
      auVar5._0_4_ = mat.m0 + mat.m9;
      auVar5._4_4_ = mat.m13 + mat.m1;
      auVar5._8_4_ = mat.m8 + mat.m2;
      auVar5._12_4_ = mat.m12 + mat.m6;
      auVar6._4_4_ = fVar7;
      auVar6._0_4_ = fVar7;
      auVar6._8_4_ = fVar7;
      auVar6._12_4_ = fVar7;
      auVar5 = divps(auVar5,auVar6);
      uVar2 = auVar5._0_8_;
      uVar3 = CONCAT44((in_stack_0000000c - mat.m8) / fVar7,fVar7 * 0.25);
      goto LAB_0010ffbb;
    }
    fVar7 = ((mat.m12 + 1.0) - in_stack_00000008) - mat.m2;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar7 = fVar7 + fVar7;
    uVar2 = CONCAT44(fVar7 * 0.25,(in_stack_0000000c + mat.m8) / fVar7);
    auVar4._4_4_ = mat.m9 - mat.m0;
    auVar4._0_4_ = mat.m1 + mat.m13;
    auVar4._8_4_ = mat.m8 + 0.0;
    auVar4._12_4_ = mat.m12 + 0.0;
  }
  else {
    fVar7 = ((in_stack_00000008 + 1.0) - mat.m12) - mat.m2;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar7 = fVar7 + fVar7;
    uVar2 = CONCAT44((in_stack_0000000c + mat.m8) / fVar7,fVar7 * 0.25);
    auVar4._4_4_ = mat.m1 - mat.m13;
    auVar4._0_4_ = mat.m0 + mat.m9;
    auVar4._8_4_ = mat.m8 + mat.m2;
    auVar4._12_4_ = mat.m12 + mat.m6;
  }
  auVar1._4_4_ = fVar7;
  auVar1._0_4_ = fVar7;
  auVar1._8_4_ = fVar7;
  auVar1._12_4_ = fVar7;
  auVar5 = divps(auVar4,auVar1);
  uVar3 = auVar5._0_8_;
LAB_0010ffbb:
  QVar8.z = (float)(int)uVar3;
  QVar8.w = (float)(int)((ulong)uVar3 >> 0x20);
  QVar8.x = (float)(int)uVar2;
  QVar8.y = (float)(int)((ulong)uVar2 >> 0x20);
  return QVar8;
}

Assistant:

RMDEF Quaternion QuaternionFromMatrix(Matrix mat)
{
    Quaternion result = { 0 };

    if ((mat.m0 > mat.m5) && (mat.m0 > mat.m10))
    {
        float s = sqrtf(1.0f + mat.m0 - mat.m5 - mat.m10)*2;

        result.x = 0.25f*s;
        result.y = (mat.m4 + mat.m1)/s;
        result.z = (mat.m2 + mat.m8)/s;
        result.w = (mat.m9 - mat.m6)/s;
    }
    else if (mat.m5 > mat.m10)
    {
        float s = sqrtf(1.0f + mat.m5 - mat.m0 - mat.m10)*2;
        result.x = (mat.m4 + mat.m1)/s;
        result.y = 0.25f*s;
        result.z = (mat.m9 + mat.m6)/s;
        result.w = (mat.m2 - mat.m8)/s;
    }
    else
    {
        float s  = sqrtf(1.0f + mat.m10 - mat.m0 - mat.m5)*2;
        result.x = (mat.m2 + mat.m8)/s;
        result.y = (mat.m9 + mat.m6)/s;
        result.z = 0.25f*s;
        result.w = (mat.m4 - mat.m1)/s;
    }

    return result;
}